

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     Destroy<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  data_ptr_t pdVar1;
  char *pcVar2;
  idx_t iVar3;
  
  if (count != 0) {
    pdVar1 = states->data;
    iVar3 = 0;
    do {
      pcVar2 = *(char **)(pdVar1 + iVar3 * 8);
      if (*pcVar2 == '\x01') {
        if ((0xc < *(uint *)(pcVar2 + 8)) && (*(void **)(pcVar2 + 0x10) != (void *)0x0)) {
          operator_delete__(*(void **)(pcVar2 + 0x10));
        }
        *pcVar2 = '\0';
      }
      iVar3 = iVar3 + 1;
    } while (count != iVar3);
  }
  return;
}

Assistant:

static void Destroy(Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
		for (idx_t i = 0; i < count; i++) {
			OP::template Destroy<STATE_TYPE>(*sdata[i], aggr_input_data);
		}
	}